

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMultimapEmplaceHint_Test::TestBody
          (Btree_BtreeMultimapEmplaceHint_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar1;
  iterator iVar2;
  const_iterator hint;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  int key_to_insert;
  char value1 [2];
  char value0 [2];
  btree_multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  s;
  undefined1 local_70 [8];
  uint local_68;
  undefined4 uStack_64;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_60;
  AssertHelper local_50;
  undefined1 local_48 [8];
  int local_40;
  undefined4 uStack_3c;
  int local_38;
  char local_34 [2];
  char local_32 [2];
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_30;
  btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
  local_20;
  
  local_38 = 0x1e240;
  local_32[0] = 'a';
  local_32[1] = '\0';
  local_20.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
        )&btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>
          ::EmptyNode()::empty_node_abi_cxx11_;
  local_20.rightmost_ =
       (node_type *)
       &btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>
        ::EmptyNode()::empty_node_abi_cxx11_;
  local_20.size_ = 0;
  iVar2 = btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>>
          ::emplace<int_const&,char_const(&)[2]>
                    ((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>>
                      *)&local_20,&local_38,&local_32);
  local_30.node = iVar2.node;
  local_30.position = iVar2.position;
  if (((ulong)local_20.rightmost_ & 7) != 0) {
LAB_001bd725:
    pcVar1 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
    goto LAB_001bd751;
  }
  local_70 = (undefined1  [8])local_20.rightmost_;
  local_68 = (uint)(byte)*(node_type *)((long)local_20.rightmost_ + 10);
  testing::internal::
  CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>,std::pair<int_const,std::__cxx11::string>&,std::pair<int_const,std::__cxx11::string>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>,std::pair<int_const,std::__cxx11::string>&,std::pair<int_const,std::__cxx11::string>*>>
            ((internal *)local_48,"iter","s.end()",&local_30,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
              *)local_70);
  if (local_48[0] != (internal)0x0) {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_3c,local_40) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_3c,local_40));
    }
    if (((ulong)local_30.node & 7) == 0) {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_48,"iter->first","key_to_insert",
                 (int *)(local_30.node + (long)local_30.position * 0x28 + 0x10),&local_38);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_70);
        if ((undefined8 *)CONCAT44(uStack_3c,local_40) == (undefined8 *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)CONCAT44(uStack_3c,local_40);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x64a,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_70 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(undefined **)local_70 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_3c,local_40) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_3c,local_40));
      }
      if (((ulong)local_30.node & 7) == 0) {
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
                  ((internal *)local_48,"iter->second","value0",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_30.node + (long)local_30.position * 0x28 + 0x18),&local_32);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_70);
          if ((undefined8 *)CONCAT44(uStack_3c,local_40) == (undefined8 *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)CONCAT44(uStack_3c,local_40);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x64b,pcVar1);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_70);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_70 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(undefined **)local_70 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_3c,local_40) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_3c,local_40));
        }
        local_34[0] = 'b';
        local_34[1] = '\0';
        hint.position = local_30.position;
        hint.node = local_30.node;
        hint._12_4_ = 0;
        iVar2 = btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>>
                ::emplace_hint<int_const&,char_const(&)[2]>
                          ((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>>
                            *)&local_20,hint,&local_38,&local_34);
        local_48 = (undefined1  [8])iVar2.node;
        local_40 = iVar2.position;
        testing::internal::
        CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>,std::pair<int_const,std::__cxx11::string>&,std::pair<int_const,std::__cxx11::string>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>,std::pair<int_const,std::__cxx11::string>&,std::pair<int_const,std::__cxx11::string>*>>
                  ((internal *)local_70,"emplace_iter","iter",
                   (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                    *)local_48,&local_30);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)CONCAT44(uStack_64,local_68);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x64e,pcVar1);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (local_60.node != (node_type *)0x0) {
            (**(code **)(*(undefined **)local_60.node + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_64,local_68) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_64,local_68));
        }
        if (((ulong)local_20.rightmost_ & 7) != 0) goto LAB_001bd725;
        local_60.node = local_20.rightmost_;
        local_60.position = (int)(byte)*(node_type *)((long)local_20.rightmost_ + 10);
        testing::internal::
        CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>,std::pair<int_const,std::__cxx11::string>&,std::pair<int_const,std::__cxx11::string>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,true>>,std::pair<int_const,std::__cxx11::string>&,std::pair<int_const,std::__cxx11::string>*>>
                  ((internal *)local_70,"emplace_iter","s.end()",
                   (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                    *)local_48,&local_60);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)CONCAT44(uStack_64,local_68);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x64f,pcVar1);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
LAB_001bd6e7:
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (local_60.node != (node_type *)0x0) {
            (**(code **)(*(undefined **)local_60.node + 8))();
          }
LAB_001bd701:
          __ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(uStack_64,local_68);
          if (__ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          goto LAB_001bd715;
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_68;
          goto LAB_001bd710;
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_64,local_68) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_64,local_68));
        }
        if (((ulong)local_48 & 7) == 0) {
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_70,"emplace_iter->first","key_to_insert",
                     (int *)((long)local_48 + (long)local_40 * 0x28 + 0x10),&local_38);
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)CONCAT44(uStack_64,local_68);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                       ,0x650,pcVar1);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if (local_60.node != (node_type *)0x0) {
              (**(code **)(*(undefined **)local_60.node + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(uStack_64,local_68) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(uStack_64,local_68));
          }
          if (((ulong)local_48 & 7) == 0) {
            testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
                      ((internal *)local_70,"emplace_iter->second","value1",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)local_48 + (long)local_40 * 0x28 + 0x18),&local_34);
            if (local_70[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_60);
              if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)CONCAT44(uStack_64,local_68);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                         ,0x651,pcVar1);
              testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
              goto LAB_001bd6e7;
            }
            goto LAB_001bd701;
          }
        }
      }
    }
    pcVar1 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
LAB_001bd751:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,pcVar1);
  }
  testing::Message::Message((Message *)local_70);
  if ((undefined8 *)CONCAT44(uStack_3c,local_40) == (undefined8 *)0x0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = *(char **)CONCAT44(uStack_3c,local_40);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
             ,0x649,pcVar1);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_70 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    (**(code **)(*(undefined **)local_70 + 8))();
  }
  __ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_3c,local_40);
  if (__ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  goto LAB_001bd715;
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40;
LAB_001bd710:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr);
LAB_001bd715:
  btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
  ::~btree(&local_20);
  return;
}

Assistant:

TEST(Btree, BtreeMultimapEmplaceHint) {
        const int key_to_insert = 123456;
        const char value0[] = "a";
        phmap::btree_multimap<int, std::string> s;
        auto iter = s.emplace(key_to_insert, value0);
        ASSERT_NE(iter, s.end());
        EXPECT_EQ(iter->first, key_to_insert);
        EXPECT_EQ(iter->second, value0);
        const char value1[] = "b";
        auto emplace_iter = s.emplace_hint(iter, key_to_insert, value1);
        EXPECT_NE(emplace_iter, iter);
        ASSERT_NE(emplace_iter, s.end());
        EXPECT_EQ(emplace_iter->first, key_to_insert);
        EXPECT_EQ(emplace_iter->second, value1);
    }